

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

void __thiscall ON_3dmSettings::Dump(ON_3dmSettings *this,ON_TextLog *dump)

{
  bool bVar1;
  int iVar2;
  wchar_t *pwVar3;
  ON_3dmConstructionPlane *this_00;
  ON_3dmView *pOVar4;
  ON_PlugInRef *this_01;
  wchar_t *model_URL;
  int i;
  ON_TextLog *dump_local;
  ON_3dmSettings *this_local;
  
  pwVar3 = ON_wString::operator_cast_to_wchar_t_(&this->m_model_URL);
  if ((pwVar3 != (wchar_t *)0x0) && (*pwVar3 != L'\0')) {
    ON_TextLog::Print(dump,"Model URL: %ls\n",pwVar3);
  }
  ON_TextLog::Print(dump,"Model space units and tolerances:\n");
  ON_TextLog::PushIndent(dump);
  ON_3dmUnitsAndTolerances::Dump(&this->m_ModelUnitsAndTolerances,dump);
  ON_TextLog::PopIndent(dump);
  ON_TextLog::Print(dump,"Page space units and tolerances:\n");
  ON_TextLog::PushIndent(dump);
  ON_3dmUnitsAndTolerances::Dump(&this->m_PageUnitsAndTolerances,dump);
  ON_TextLog::PopIndent(dump);
  ON_TextLog::Print(dump,"Render mesh settings:\n");
  ON_TextLog::PushIndent(dump);
  ON_MeshParameters::Dump(&this->m_RenderMeshSettings,dump);
  ON_TextLog::PopIndent(dump);
  ON_TextLog::Print(dump,"Analysis mesh settings:\n");
  ON_TextLog::PushIndent(dump);
  ON_MeshParameters::Dump(&this->m_AnalysisMeshSettings,dump);
  ON_TextLog::PopIndent(dump);
  ON_TextLog::Print(dump,"Render settings:\n");
  ON_TextLog::PushIndent(dump);
  ON_3dmRenderSettings::Dump(&this->m_RenderSettings,dump);
  ON_TextLog::PopIndent(dump);
  ON_TextLog::Print(dump,"Annotation settings:\n");
  ON_TextLog::PushIndent(dump);
  ON_3dmAnnotationSettings::Dump(&this->m_AnnotationSettings,dump);
  ON_TextLog::PopIndent(dump);
  ON_TextLog::Print(dump,"Construction plane grid defaults:\n");
  ON_TextLog::PushIndent(dump);
  ON_3dmConstructionPlaneGridDefaults::Dump(&this->m_GridDefaults,dump);
  ON_TextLog::PopIndent(dump);
  ON_TextLog::Print(dump,"Named construction planes:\n");
  ON_TextLog::PushIndent(dump);
  for (model_URL._4_4_ = 0;
      iVar2 = ON_ClassArray<ON_3dmConstructionPlane>::Count(&this->m_named_cplanes),
      (int)model_URL._4_4_ < iVar2; model_URL._4_4_ = model_URL._4_4_ + 1) {
    ON_TextLog::Print(dump,"named construction plane %d:\n");
    ON_TextLog::PushIndent(dump);
    this_00 = ON_ClassArray<ON_3dmConstructionPlane>::operator[]
                        (&this->m_named_cplanes,model_URL._4_4_);
    ON_3dmConstructionPlane::Dump(this_00,dump);
    ON_TextLog::PopIndent(dump);
  }
  ON_TextLog::PopIndent(dump);
  ON_TextLog::Print(dump,"Named views:\n");
  ON_TextLog::PushIndent(dump);
  for (model_URL._4_4_ = 0; iVar2 = ON_ClassArray<ON_3dmView>::Count(&this->m_named_views),
      (int)model_URL._4_4_ < iVar2; model_URL._4_4_ = model_URL._4_4_ + 1) {
    ON_TextLog::Print(dump,"named view %d:\n",(ulong)model_URL._4_4_);
    ON_TextLog::PushIndent(dump);
    pOVar4 = ON_ClassArray<ON_3dmView>::operator[](&this->m_named_views,model_URL._4_4_);
    ON_3dmView::Dump(pOVar4,dump);
    ON_TextLog::PopIndent(dump);
  }
  ON_TextLog::PopIndent(dump);
  ON_TextLog::Print(dump,"Model views:\n");
  ON_TextLog::PushIndent(dump);
  for (model_URL._4_4_ = 0; iVar2 = ON_ClassArray<ON_3dmView>::Count(&this->m_views),
      (int)model_URL._4_4_ < iVar2; model_URL._4_4_ = model_URL._4_4_ + 1) {
    ON_TextLog::Print(dump,"model view %d:\n",(ulong)model_URL._4_4_);
    ON_TextLog::PushIndent(dump);
    pOVar4 = ON_ClassArray<ON_3dmView>::operator[](&this->m_views,model_URL._4_4_);
    ON_3dmView::Dump(pOVar4,dump);
    ON_TextLog::PopIndent(dump);
  }
  ON_TextLog::PopIndent(dump);
  ON_TextLog::Print(dump,"New object attributes:\n");
  ON_TextLog::PushIndent(dump);
  ON_TextLog::Print(dump,"Current display color rgb");
  ON_TextLog::PrintRGB(dump,&this->m_current_color);
  ON_TextLog::Print(dump,":\n");
  ON_TextLog::Print(dump,"Current display color source = %d\n",(ulong)this->m_current_color_source);
  ON_TextLog::Print(dump,"Current plot color rgb");
  ON_TextLog::PrintRGB(dump,&this->m_current_plot_color);
  ON_TextLog::Print(dump,":\n");
  ON_TextLog::Print(dump,"Current plot color source = %d\n",(ulong)this->m_current_plot_color_source
                   );
  if (this->m_V5_current_render_material_index != -0x7fffffff) {
    ON_TextLog::Print(dump,"Current V5 material index = %d\n",
                      (ulong)(uint)this->m_V5_current_render_material_index);
  }
  ON_TextLog::Print(dump,"Current material source = %d\n",(ulong)this->m_current_material_source);
  if (this->m_V5_current_line_pattern_index != -0x7fffffff) {
    ON_TextLog::Print(dump,"Current V5 linetype index = %d\n",
                      (ulong)(uint)this->m_V5_current_line_pattern_index);
  }
  ON_TextLog::Print(dump,"Current linetype source = %d\n",(ulong)this->m_current_linetype_source);
  if (this->m_V5_current_layer_index != -0x7fffffff) {
    ON_TextLog::Print(dump,"Current V5 layer index = %d\n",
                      (ulong)(uint)this->m_V5_current_layer_index);
  }
  bVar1 = ON_TextLog::IsTextHash(dump);
  if ((!bVar1) && (this->m_V5_current_text_style_index != -0x7fffffff)) {
    ON_TextLog::Print(dump,"Current font index = %d\n",
                      (ulong)(uint)this->m_V5_current_text_style_index);
  }
  if (this->m_V5_current_dimension_style_index != -0x7fffffff) {
    ON_TextLog::Print(dump,"Current V5 dimstyle index = %d\n",
                      (ulong)(uint)this->m_V5_current_dimension_style_index);
  }
  ON_TextLog::Print(dump,"Current wire density = %d\n",(ulong)(uint)this->m_current_wire_density);
  ON_TextLog::Print(dump,"Linetype diaplay scale = %g\n",this->m_linetype_display_scale);
  ON_TextLog::PopIndent(dump);
  ON_TextLog::Print(dump,"Plug-in list\n");
  ON_TextLog::PushIndent(dump);
  for (model_URL._4_4_ = 0; iVar2 = ON_ClassArray<ON_PlugInRef>::Count(&this->m_plugin_list),
      (int)model_URL._4_4_ < iVar2; model_URL._4_4_ = model_URL._4_4_ + 1) {
    ON_TextLog::Print(dump,"plug-in %d:\n",(ulong)model_URL._4_4_);
    ON_TextLog::PushIndent(dump);
    this_01 = ON_ClassArray<ON_PlugInRef>::operator[](&this->m_plugin_list,model_URL._4_4_);
    ON_PlugInRef::Dump(this_01,dump);
    ON_TextLog::PopIndent(dump);
  }
  ON_TextLog::PopIndent(dump);
  return;
}

Assistant:

void ON_3dmSettings::Dump( ON_TextLog& dump ) const
{
  int i;

  const wchar_t* model_URL = static_cast< const wchar_t* >(m_model_URL);
  if ( model_URL && *model_URL ) 
  {
    dump.Print("Model URL: %ls\n",model_URL);
  }
  dump.Print("Model space units and tolerances:\n");
  dump.PushIndent();
  m_ModelUnitsAndTolerances.Dump(dump);
  dump.PopIndent();

  dump.Print("Page space units and tolerances:\n");
  dump.PushIndent();
  m_PageUnitsAndTolerances.Dump(dump);
  dump.PopIndent();

  dump.Print("Render mesh settings:\n");
  dump.PushIndent();
  m_RenderMeshSettings.Dump(dump);
  dump.PopIndent();

  dump.Print("Analysis mesh settings:\n");
  dump.PushIndent();
  m_AnalysisMeshSettings.Dump(dump);
  dump.PopIndent();

  dump.Print("Render settings:\n");
  dump.PushIndent();
  m_RenderSettings.Dump(dump);
  dump.PopIndent();

  dump.Print("Annotation settings:\n");
  dump.PushIndent();
  m_AnnotationSettings.Dump(dump);
  dump.PopIndent();

  dump.Print("Construction plane grid defaults:\n");
  dump.PushIndent();
  m_GridDefaults.Dump(dump);
  dump.PopIndent();

  dump.Print("Named construction planes:\n");
  dump.PushIndent();
  for ( i = 0; i < m_named_cplanes.Count(); i++ )
  {
    dump.Print("named construction plane %d:\n");
    dump.PushIndent();
    m_named_cplanes[i].Dump(dump);
    dump.PopIndent();
  }
  dump.PopIndent();

  dump.Print("Named views:\n");
  dump.PushIndent();
  for ( i = 0; i < m_named_views.Count(); i++ )
  {
    dump.Print("named view %d:\n",i);
    dump.PushIndent();
    m_named_views[i].Dump(dump);
    dump.PopIndent();
  }
  dump.PopIndent();

  dump.Print("Model views:\n");
  dump.PushIndent();
  for ( i = 0; i < m_views.Count(); i++ )
  {
    dump.Print("model view %d:\n",i);
    dump.PushIndent();
    m_views[i].Dump(dump);
    dump.PopIndent();
  }
  dump.PopIndent();

  dump.Print("New object attributes:\n");
  dump.PushIndent();
  {
    dump.Print("Current display color rgb");dump.PrintRGB(m_current_color); dump.Print(":\n");
    dump.Print("Current display color source = %d\n",m_current_color_source);
    dump.Print("Current plot color rgb");dump.PrintRGB(m_current_plot_color); dump.Print(":\n");
    dump.Print("Current plot color source = %d\n",m_current_plot_color_source);
    if ( ON_UNSET_INT_INDEX != m_V5_current_render_material_index)
      dump.Print("Current V5 material index = %d\n",m_V5_current_render_material_index);
    dump.Print("Current material source = %d\n",m_current_material_source);
    if ( ON_UNSET_INT_INDEX != m_V5_current_line_pattern_index)
      dump.Print("Current V5 linetype index = %d\n",m_V5_current_line_pattern_index);
    dump.Print("Current linetype source = %d\n",m_current_linetype_source);
    if ( ON_UNSET_INT_INDEX != m_V5_current_layer_index)
      dump.Print("Current V5 layer index = %d\n",m_V5_current_layer_index);
    if (false == dump.IsTextHash())
    {
      // The legacy m_V5_current_text_style_index varies
      // depending on what application writes the file.
      // It must be ignored when comparing content.
      if (ON_UNSET_INT_INDEX != m_V5_current_text_style_index)
        dump.Print("Current font index = %d\n", m_V5_current_text_style_index);
    }
    if ( ON_UNSET_INT_INDEX != m_V5_current_dimension_style_index)
      dump.Print("Current V5 dimstyle index = %d\n",m_V5_current_dimension_style_index);
    dump.Print("Current wire density = %d\n",m_current_wire_density);
    dump.Print("Linetype diaplay scale = %g\n",m_linetype_display_scale);
  }
  dump.PopIndent();

  dump.Print("Plug-in list\n");
  dump.PushIndent();
  for ( i = 0; i < m_plugin_list.Count(); i++ )
  {
    dump.Print("plug-in %d:\n",i);
    dump.PushIndent();
    m_plugin_list[i].Dump(dump);
    dump.PopIndent();
  }
  dump.PopIndent();

}